

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

CURLcode trc_opt(char *config)

{
  int iVar1;
  char *__s;
  int local_34;
  int lvl;
  char *tmp;
  char *tok_buf;
  char *token;
  char *config_local;
  
  token = config;
  __s = (*Curl_cstrdup)(config);
  if (__s == (char *)0x0) {
    config_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    tok_buf = strtok_r(__s,", ",&tmp);
    while (tok_buf != (char *)0x0) {
      if (*tok_buf == '+') {
        local_34 = 1;
        tok_buf = tok_buf + 1;
      }
      else if (*tok_buf == '-') {
        local_34 = 0;
        tok_buf = tok_buf + 1;
      }
      else {
        local_34 = 1;
      }
      iVar1 = curl_strequal(tok_buf,"all");
      if (iVar1 == 0) {
        iVar1 = curl_strequal(tok_buf,"protocol");
        if (iVar1 == 0) {
          iVar1 = curl_strequal(tok_buf,"network");
          if (iVar1 == 0) {
            iVar1 = curl_strequal(tok_buf,"proxy");
            if (iVar1 == 0) {
              trc_apply_level_by_name(tok_buf,local_34);
            }
            else {
              trc_apply_level_by_category(4,local_34);
            }
          }
          else {
            trc_apply_level_by_category(2,local_34);
          }
        }
        else {
          trc_apply_level_by_category(1,local_34);
        }
      }
      else {
        trc_apply_level_by_category(0,local_34);
      }
      tok_buf = strtok_r((char *)0x0,", ",&tmp);
    }
    (*Curl_cfree)(__s);
    config_local._4_4_ = CURLE_OK;
  }
  return config_local._4_4_;
}

Assistant:

static CURLcode trc_opt(const char *config)
{
  char *token, *tok_buf, *tmp;
  int lvl;

  tmp = strdup(config);
  if(!tmp)
    return CURLE_OUT_OF_MEMORY;

  token = strtok_r(tmp, ", ", &tok_buf);
  while(token) {
    switch(*token) {
      case '-':
        lvl = CURL_LOG_LVL_NONE;
        ++token;
        break;
      case '+':
        lvl = CURL_LOG_LVL_INFO;
        ++token;
        break;
      default:
        lvl = CURL_LOG_LVL_INFO;
        break;
    }
    if(strcasecompare(token, "all"))
      trc_apply_level_by_category(TRC_CT_NONE, lvl);
    else if(strcasecompare(token, "protocol"))
      trc_apply_level_by_category(TRC_CT_PROTOCOL, lvl);
    else if(strcasecompare(token, "network"))
      trc_apply_level_by_category(TRC_CT_NETWORK, lvl);
    else if(strcasecompare(token, "proxy"))
      trc_apply_level_by_category(TRC_CT_PROXY, lvl);
    else
      trc_apply_level_by_name(token, lvl);

    token = strtok_r(NULL, ", ", &tok_buf);
  }
  free(tmp);
  return CURLE_OK;
}